

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate.c
# Opt level: O3

int cm_zlib_deflateSetDictionary(z_streamp_conflict strm,Bytef *dictionary,uInt dictLength)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  internal_state_conflict1 *piVar4;
  byte *pbVar5;
  Posf *pPVar6;
  Posf *pPVar7;
  uLong uVar8;
  byte bVar9;
  int iVar10;
  uint uVar11;
  ulong uVar12;
  uint uVar13;
  
  iVar10 = -2;
  if ((strm != (z_streamp_conflict)0x0) &&
     (piVar4 = strm->state, dictionary != (Bytef *)0x0 && piVar4 != (internal_state_conflict1 *)0x0)
     ) {
    iVar10 = piVar4->wrap;
    if (iVar10 != 0) {
      if (iVar10 == 2) {
        return -2;
      }
      if ((iVar10 == 1) && (piVar4->status != 0x2a)) {
        return -2;
      }
      uVar8 = cm_zlib_adler32(strm->adler,dictionary,dictLength);
      strm->adler = uVar8;
    }
    iVar10 = 0;
    if (2 < dictLength) {
      uVar13 = piVar4->w_size - 0x106;
      iVar10 = 0;
      uVar12 = (ulong)(dictLength - uVar13);
      if (dictLength < uVar13) {
        uVar12 = 0;
      }
      if (dictLength <= uVar13) {
        uVar13 = dictLength;
      }
      memcpy(piVar4->window,dictionary + uVar12,(ulong)uVar13);
      piVar4->strstart = uVar13;
      piVar4->block_start = (ulong)uVar13;
      pbVar5 = piVar4->window;
      bVar1 = *pbVar5;
      piVar4->ins_h = (uint)bVar1;
      bVar9 = (byte)piVar4->hash_shift;
      uVar2 = piVar4->hash_mask;
      uVar11 = ((uint)pbVar5[1] ^ (uint)bVar1 << (bVar9 & 0x1f)) & uVar2;
      piVar4->ins_h = uVar11;
      pPVar6 = piVar4->head;
      pPVar7 = piVar4->prev;
      uVar3 = piVar4->w_mask;
      uVar12 = 0;
      do {
        uVar11 = ((uint)pbVar5[(uint)uVar12 + 2] ^ uVar11 << (bVar9 & 0x1f)) & uVar2;
        piVar4->ins_h = uVar11;
        pPVar7[uVar3 & (uint)uVar12] = pPVar6[uVar11];
        pPVar6[uVar11] = (Posf)uVar12;
        uVar12 = uVar12 + 1;
      } while ((uVar13 - 2) + (uint)(uVar13 == 2) != uVar12);
    }
  }
  return iVar10;
}

Assistant:

int ZEXPORT deflateSetDictionary (strm, dictionary, dictLength)
    z_streamp strm;
    const Bytef *dictionary;
    uInt  dictLength;
{
    deflate_state *s;
    uInt length = dictLength;
    uInt n;
    IPos hash_head = 0;

    if (strm == Z_NULL || strm->state == Z_NULL || dictionary == Z_NULL ||
        strm->state->wrap == 2 ||
        (strm->state->wrap == 1 && strm->state->status != INIT_STATE))
        return Z_STREAM_ERROR;

    s = strm->state;
    if (s->wrap)
        strm->adler = adler32(strm->adler, dictionary, dictLength);

    if (length < MIN_MATCH) return Z_OK;
    if (length > MAX_DIST(s)) {
        length = MAX_DIST(s);
        dictionary += dictLength - length; /* use the tail of the dictionary */
    }
    zmemcpy(s->window, dictionary, length);
    s->strstart = length;
    s->block_start = (long)length;

    /* Insert all strings in the hash table (except for the last two bytes).
     * s->lookahead stays null, so s->ins_h will be recomputed at the next
     * call of fill_window.
     */
    s->ins_h = s->window[0];
    UPDATE_HASH(s, s->ins_h, s->window[1]);
    for (n = 0; n <= length - MIN_MATCH; n++) {
        INSERT_STRING(s, n, hash_head);
    }
    if (hash_head) hash_head = 0;  /* to make compiler happy */
    return Z_OK;
}